

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O1

void __thiscall
crnlib::vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::~vector
          (vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node> *this)

{
  uint uVar1;
  vq_node *pvVar2;
  void *p;
  long lVar3;
  
  pvVar2 = this->m_p;
  if (pvVar2 != (vq_node *)0x0) {
    uVar1 = this->m_size;
    if ((ulong)uVar1 != 0) {
      lVar3 = 0;
      do {
        p = *(void **)((long)(&pvVar2->m_centroid + 1) + lVar3 + 0x10);
        if (p != (void *)0x0) {
          crnlib_free(p);
        }
        lVar3 = lVar3 + 0x48;
      } while ((ulong)uVar1 * 0x48 != lVar3);
    }
    crnlib_free(this->m_p);
  }
  return;
}

Assistant:

inline ~vector()
        {
            if (m_p)
            {
                scalar_type<T>::destruct_array(m_p, m_size);
                crnlib_free(m_p);
            }
        }